

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.cpp
# Opt level: O2

char * luaZ_openspace(lua_State *L,Mbuffer *buff,size_t n)

{
  char *pcVar1;
  size_t nsize;
  
  if (buff->buffsize < n) {
    nsize = 0x20;
    if (0x20 < n) {
      nsize = n;
    }
    if (nsize + 1 < 0xfffffffffffffffe) {
      pcVar1 = (char *)luaM_realloc_(L,buff->buffer,buff->buffsize,nsize);
    }
    else {
      pcVar1 = (char *)luaM_toobig(L);
    }
    buff->buffer = pcVar1;
    buff->buffsize = nsize;
  }
  else {
    pcVar1 = buff->buffer;
  }
  return pcVar1;
}

Assistant:

char *luaZ_openspace (lua_State *L, Mbuffer *buff, size_t n) {
  if (n > buff->buffsize) {
    if (n < LUA_MINBUFFER) n = LUA_MINBUFFER;
    luaZ_resizebuffer(L, buff, n);
  }
  return buff->buffer;
}